

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariantsElement
          (AsciiParser *this,string *out_key,string *out_var)

{
  bool bVar1;
  ostream *poVar2;
  string key_name;
  string var;
  string type_name;
  string local_1b8;
  ostringstream ss_e;
  
  type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
  type_name._M_string_length = 0;
  type_name.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadIdentifier(this,&type_name);
  if (bVar1) {
    bVar1 = ::std::operator!=(&type_name,"string");
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,999);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)&ss_e,
                                 "TinyUSDZ only accepts type `string` for `variants` element.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&key_name);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    else {
      bVar1 = SkipWhitespace(this);
      if (bVar1) {
        key_name._M_dataplus._M_p = (pointer)&key_name.field_2;
        key_name._M_string_length = 0;
        key_name.field_2._M_local_buf[0] = '\0';
        bVar1 = ReadIdentifier(this,&key_name);
        if (bVar1) {
LAB_0028946d:
          bVar1 = SkipWhitespace(this);
          if (!bVar1) goto LAB_002895c6;
          bVar1 = Expect(this,'=');
          if (!bVar1) goto LAB_002895c6;
          bVar1 = SkipWhitespace(this);
          if (!bVar1) goto LAB_002895c6;
          var._M_dataplus._M_p = (pointer)&var.field_2;
          var._M_string_length = 0;
          var.field_2._M_local_buf[0] = '\0';
          bVar1 = ReadBasicType(this,&var);
          if (bVar1) {
            ::std::__cxx11::string::_M_assign((string *)out_key);
            ::std::__cxx11::string::_M_assign((string *)out_var);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x406);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse `string`");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_1b8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          }
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          bVar1 = ReadStringLiteral(this,&key_name);
          if (bVar1) goto LAB_0028946d;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseVariantsElement");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f4);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse dictionary key identifier.\n"
                                    );
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&var);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002895c6:
          bVar1 = false;
        }
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002894e7;
      }
    }
  }
  bVar1 = false;
LAB_002894e7:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ParseVariantsElement(std::string *out_key,
                                       std::string *out_var) {
  // variants_element: string name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  // must be `string`
  if (type_name != value::kString) {
    PUSH_ERROR_AND_RETURN(
        "TinyUSDZ only accepts type `string` for `variants` element.");
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string var;
  if (!ReadBasicType(&var)) {
    PUSH_ERROR_AND_RETURN("Failed to parse `string`");
  }

  DCOUT("key: " << key_name << ", value: " << var);

  (*out_key) = key_name;
  (*out_var) = var;

  return true;
}